

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O1

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,IndexedMatrixArray *u,Vector *xh0,Matrix *p,
          Matrix *q,Matrix *r,double dt)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  DenseStorage<double,__1,__1,__1,_0> *pDVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  IndexedMatrixArray *xh;
  Matrix c;
  Vector xhk;
  Matrix a;
  Vector dx;
  ExtendedKalmanFilter filter;
  IMUDynamicalSystem imuFunctor;
  void *local_570;
  long local_568;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_558;
  void *local_550;
  long local_548;
  DenseStorage<double,__1,__1,__1,_0> local_540;
  undefined8 local_528;
  Vector3 local_518;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_4f8;
  void *local_4f0;
  long local_4e8;
  void *local_4e0 [2];
  code *local_4d0 [78];
  void *local_260;
  void *local_240;
  void *local_218;
  void *local_208;
  void *local_1f0;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  void *local_1a8;
  void *local_198;
  IMUDynamicalSystem local_188 [344];
  
  local_558 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)dt;
  ExtendedKalmanFilter::ExtendedKalmanFilter((ExtendedKalmanFilter *)local_4d0,0x12,6,6,false,true);
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem(local_188);
  stateObservation::IMUDynamicalSystem::setSamplingPeriod((double)local_558);
  stateObservation::ExtendedKalmanFilter::setFunctor((DynamicalSystemFunctorBase *)local_4d0);
  stateObservation::ZeroDelayObserver::setState((Matrix *)local_4d0,(uint)xh0);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)local_4d0);
  uVar9 = 0xffffffff;
  if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 + (ulong)(*(long *)(y + 0x50) == 0)) *
      0x15 != (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
    uVar9 = *(int *)y - 1;
  }
  lVar6 = (*(long *)(u + 0x28) - *(long *)(u + 0x18) >> 3) * -0x5555555555555555 +
          (*(long *)(u + 0x38) - *(long *)(u + 0x40) >> 3) * -0x5555555555555555 +
          ((*(long *)(u + 0x50) - *(long *)(u + 0x30) >> 3) + -1 + (ulong)(*(long *)(u + 0x50) == 0)
          ) * 0x15;
  if (lVar6 != 0) {
    uVar11 = *(uint *)u;
    if ((uVar11 <= uVar9) && ((ulong)uVar9 < lVar6 + (ulong)uVar11)) {
      local_4f8 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                   *)(u + 0x18);
      pDVar4 = (DenseStorage<double,__1,__1,__1,_0> *)
               std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[](local_4f8,(ulong)(uVar9 - uVar11));
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_540,pDVar4);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_570,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_540);
      stateObservation::ZeroDelayObserver::setInput((Matrix *)local_4d0,(uint)&local_570);
      free(local_570);
      free(local_540.m_data);
      stateObservation::KalmanFilterBase::setR((Matrix *)local_4d0);
      stateObservation::KalmanFilterBase::setQ((Matrix *)local_4d0);
      stateObservation::ObserverBase::stateVectorConstant(1.0);
      if (local_568 < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_540.m_rows = local_568;
      local_528 = 0x3e45798ee2308c3a;
      local_540.m_data = (double *)&local_570;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_4e0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_540);
      free(local_570);
      stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)this);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_540,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0);
      uVar9 = 0xffffffff;
      if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
          ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 + (ulong)(*(long *)(y + 0x50) == 0)
          ) * 0x15 != (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
        uVar9 = *(int *)y - 1;
      }
      IndexedMatrixArray::setValue((IndexedMatrixArray *)this,(Matrix *)&local_540,uVar9);
      free(local_540.m_data);
      uVar9 = 0;
      if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
          ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 + (ulong)(*(long *)(y + 0x50) == 0)
          ) * 0x15 != (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
        uVar9 = *(uint *)y;
      }
      local_558 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                   *)(y + 0x18);
      do {
        lVar6 = (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * -0x5555555555555555 +
                (*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
                ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 +
                (ulong)(*(long *)(y + 0x50) == 0)) * 0x15;
        uVar11 = *(uint *)y;
        uVar7 = (uVar11 - 1) + (int)lVar6;
        if (lVar6 == 0) {
          uVar7 = 0;
        }
        if (uVar7 < uVar9) {
          free(local_4e0[0]);
          stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem(local_188);
          local_4d0[0] = __cxa_guard_acquire;
          free(local_198);
          free(local_1a8);
          free(local_1b8);
          free(local_1c8);
          free(local_1d8);
          free(local_1f0);
          free(local_208);
          free(local_218);
          free(local_240);
          free(local_260);
          KalmanFilterBase::~KalmanFilterBase((KalmanFilterBase *)local_4d0);
          return this;
        }
        if (((lVar6 == 0) || (uVar9 < uVar11)) || (lVar6 + (ulong)uVar11 <= (ulong)uVar9)) break;
        pDVar4 = (DenseStorage<double,__1,__1,__1,_0> *)
                 std::
                 _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                 ::operator[](local_558,(ulong)(uVar9 - uVar11));
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_540,pDVar4);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_570,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_540);
        uVar11 = (uint)(PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_570;
        stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)local_4d0,uVar11);
        free(local_570);
        free(local_540.m_data);
        lVar6 = (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * -0x5555555555555555 +
                (*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
                ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 +
                (ulong)(*(long *)(y + 0x50) == 0)) * 0x15;
        if ((lVar6 != 0) && (uVar9 < ((int)lVar6 + *(int *)y) - 1U)) {
          lVar6 = (*(long *)(u + 0x28) - *(long *)(u + 0x18) >> 3) * -0x5555555555555555 +
                  (*(long *)(u + 0x38) - *(long *)(u + 0x40) >> 3) * -0x5555555555555555 +
                  ((*(long *)(u + 0x50) - *(long *)(u + 0x30) >> 3) + -1 +
                  (ulong)(*(long *)(u + 0x50) == 0)) * 0x15;
          if (lVar6 == 0) break;
          uVar7 = *(uint *)u;
          if ((uVar9 < uVar7) || (lVar6 + (ulong)uVar7 <= (ulong)uVar9)) break;
          pDVar4 = (DenseStorage<double,__1,__1,__1,_0> *)
                   std::
                   _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                   ::operator[](local_4f8,(ulong)(uVar9 - uVar7));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_540,pDVar4);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_570,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_540);
          stateObservation::ZeroDelayObserver::setInput((Matrix *)local_4d0,uVar11);
          free(local_570);
          free(local_540.m_data);
        }
        stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_540);
        stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_570);
        stateObservation::KalmanFilterBase::setA((Matrix *)local_4d0);
        stateObservation::KalmanFilterBase::setC((Matrix *)local_4d0);
        stateObservation::ZeroDelayObserver::getEstimatedState((uint)&local_550);
        if (local_548 < 6) {
LAB_00106f3a:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        local_518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = *(double *)((long)local_550 + 0x18);
        local_518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = *(double *)((long)local_550 + 0x20);
        local_518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = *(double *)((long)local_550 + 0x28);
        kine::regulateOrientationVector((kine *)&local_4f0,&local_518);
        if (local_548 < 6) goto LAB_00106f3a;
        if (local_4e8 != 3) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                       );
        }
        uVar5 = (long)local_550 + 0x18;
        uVar8 = (ulong)((uint)(uVar5 >> 3) & 1);
        if ((uVar5 & 7) != 0) {
          uVar8 = 3;
        }
        if (uVar8 != 0) {
          uVar10 = 0;
          do {
            *(undefined8 *)(uVar5 + uVar10 * 8) = *(undefined8 *)((long)local_4f0 + uVar10 * 8);
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        uVar11 = (uint)uVar8 ^ 3;
        uVar10 = (uVar11 & 0xfffffffe) + uVar8;
        if (1 < uVar11) {
          do {
            puVar1 = (undefined8 *)((long)local_4f0 + uVar8 * 8);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)(uVar5 + uVar8 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            uVar8 = uVar8 + 2;
          } while (uVar8 < uVar10);
        }
        if ((uint)uVar10 < 3) {
          do {
            *(undefined8 *)(uVar5 + uVar10 * 8) = *(undefined8 *)((long)local_4f0 + uVar10 * 8);
            uVar10 = uVar10 + 1;
          } while (uVar10 != 3);
        }
        free(local_4f0);
        stateObservation::ZeroDelayObserver::setState
                  ((Matrix *)local_4d0,
                   (uint)(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_550);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_518,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_550);
        IndexedMatrixArray::setValue((IndexedMatrixArray *)this,(Matrix *)&local_518,uVar9);
        free((void *)local_518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0]);
        free(local_550);
        free(local_570);
        free(local_540.m_data);
        uVar9 = uVar9 + 1;
      } while( true );
    }
  }
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction
    (
    const IndexedMatrixArray & y,
    const IndexedMatrixArray & u,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=6;

    ///initialization of the extended Kalman filter
    ExtendedKalmanFilter filter(stateSize, measurementSize, inputSize, false);

    ///initalization of the functor
    IMUDynamicalSystem imuFunctor;
    imuFunctor.setSamplingPeriod(dt);
    filter.setFunctor(& imuFunctor);

    ///the initalization of the estimation of the initial state
    filter.setState(xh0,y.getFirstIndex()-1);

    ///computation and initialization of the covariance matrix of the initial state
    filter.setStateCovariance(p);

    ///set initial input
    filter.setInput(u[y.getFirstIndex()-1],y.getFirstIndex()-1);

    ///The covariance matrix of the process noise and the measurement noise
    /// for the extended Kalman filter
    filter.setR(r);
    filter.setQ(q);

    ///set the derivation step for the finite difference method
    Vector dx=filter.stateVectorConstant(1)*1e-8;

    ///the array of the state estimations over time
    IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        ///introduction of the measurement
        filter.setMeasurement(y[i],i);

        ///introduction of the input
        if (i<y.getLastIndex())
            filter.setInput(u[i],i);

        ///get the jacobians by finite differences and provide
        ///them to the Kalman filter
        Matrix a=filter.getAMatrixFD(dx);
        Matrix c= filter.getCMatrixFD(dx);
        filter.setA(a);
        filter.setC(c);

        ///get the estimation and give it to the array
        Vector xhk=filter.getEstimatedState(i);

        ///regulate the part of orientation vector in the state vector
        xhk.segment(kine::ori,3)=kine::regulateOrientationVector
                                                    (xhk.segment(kine::ori,3));

        ///give the new value of the state to the kalman filter.
        ///This step is usually unnecessary, unless we modify the
        ///value of the state esimation which is the case here.
        filter.setState(xhk,i);

        xh.setValue(xhk,i);
    }

    return xh;
}